

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O0

int scanForQuads(StructureConfig sconf,int radius,uint64_t s48,uint64_t *lowBits,int lowBitN,
                uint64_t salt,int x,int z,int w,int h,Pos *qplist,int n)

{
  StructureConfig sconf_00;
  int iVar1;
  uint64_t in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int64_t unaff_R14;
  int64_t unaff_R15;
  int64_t unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000018;
  int in_stack_00000030;
  uint64_t invB;
  int cnt;
  int i;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffd8;
  
  iVar2 = 0;
  if ((in_R8D != 0x14) && (in_R8D != 0x30)) {
    mulInv(0x1ef1565bd5,1L << ((byte)in_R8D & 0x3f));
  }
  iVar3 = 0;
  while( true ) {
    if (*(long *)(in_RCX + (long)iVar3 * 8) == 0) {
      return iVar2;
    }
    sconf_00.regionSize = (char)in_RDI;
    sconf_00.chunkRange = (char)((ulong)in_RDI >> 8);
    sconf_00.structType = (char)((ulong)in_RDI >> 0x10);
    sconf_00.dim = (char)((ulong)in_RDI >> 0x18);
    sconf_00.rarity = (float)(int)((ulong)in_RDI >> 0x20);
    sconf_00.salt = in_stack_ffffffffffffffd8;
    iVar1 = scanForQuadBits(sconf_00,(int)((ulong)in_RDX >> 0x20),in_RCX,
                            CONCAT44(in_R8D,in_stack_ffffffffffffffb0),(int)((ulong)in_R9 >> 0x20),
                            CONCAT44(iVar3,iVar2),unaff_R14,unaff_R15,unaff_retaddr,
                            CONCAT44(in_stack_0000000c,in_stack_00000008),
                            (Pos *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000018);
    iVar2 = iVar1 + iVar2;
    if (in_stack_00000030 <= iVar2) break;
    iVar3 = iVar3 + 1;
  }
  return iVar2;
}

Assistant:

int scanForQuads(
        const StructureConfig sconf, int radius, uint64_t s48,
        const uint64_t *lowBits, int lowBitN, uint64_t salt,
        int x, int z, int w, int h, Pos *qplist, int n)
{
    int i, cnt = 0;
    uint64_t invB;
    if (lowBitN == 20)
        invB = 132477ULL;
    else if (lowBitN == 48)
        invB = 211541297333629ULL;
    else
        invB = mulInv(132897987541ULL, (1ULL << lowBitN));

    for (i = 0; lowBits[i]; i++)
    {
        cnt += scanForQuadBits(sconf, radius, s48, lowBits[i]-salt, lowBitN, invB,
                x, z, w, h, qplist+cnt, n-cnt);
        if (cnt >= n)
            break;
    }

    return cnt;
}